

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_sum(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  ushort *puVar1;
  ly_ctx *plVar2;
  lyxp_set_node *plVar3;
  ly_bool lVar4;
  LY_ERR LVar5;
  char *pcVar6;
  char **str_00;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  LY_ERR ret__;
  LY_ERR rc;
  lysc_node_leaf *sleaf;
  lyxp_set set_item;
  longdouble *plStack_50;
  uint32_t i;
  char *str;
  longdouble num;
  uint32_t local_2c;
  lyxp_set *plStack_28;
  uint32_t options_local;
  lyxp_set *set_local;
  lyxp_set **pplStack_18;
  uint32_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  local_2c = options;
  plStack_28 = set;
  set_local._4_4_ = UNUSED_arg_count;
  pplStack_18 = args;
  if ((options & 0x1c) == 0) {
    set_fill_number(set,(longdouble)0);
    if ((*pplStack_18)->type == LYXP_SET_NODE_SET) {
      if ((*pplStack_18)->used == 0) {
        args_local._4_4_ = LY_SUCCESS;
      }
      else {
        set_init((lyxp_set *)&sleaf,plStack_28);
        sleaf._0_4_ = 0;
        set_item._8_8_ = calloc(1,0x10);
        if ((void *)set_item._8_8_ == (void *)0x0) {
          ly_log(plStack_28->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_sum");
          args_local._4_4_ = LY_EMEM;
        }
        else {
          set_item.val._8_4_ = 1;
          set_item.val._12_4_ = 1;
          for (set_item._140_4_ = 0; (uint)set_item._140_4_ < (*pplStack_18)->used;
              set_item._140_4_ = set_item._140_4_ + 1) {
            plVar3 = ((*pplStack_18)->val).nodes;
            *(lyd_node **)set_item._8_8_ = plVar3[(uint)set_item._140_4_].node;
            *(undefined8 *)(set_item._8_8_ + 8) =
                 *(undefined8 *)&plVar3[(uint)set_item._140_4_].type;
            str_00 = (char **)&stack0xffffffffffffffb0;
            LVar5 = cast_node_set_to_string((lyxp_set *)&sleaf,str_00);
            if (LVar5 != LY_SUCCESS) {
              return LVar5;
            }
            cast_string_to_number(plStack_50,(char *)str_00);
            _str = in_ST0;
            free(plStack_50);
            (plStack_28->val).num = (plStack_28->val).num + _str;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = in_ST6;
          }
          free((void *)set_item._8_8_);
          args_local._4_4_ = LY_SUCCESS;
        }
      }
    }
    else {
      plVar2 = plStack_28->ctx;
      pcVar6 = print_set_type(*pplStack_18);
      ly_vlog(plVar2,(char *)0x0,LYVE_XPATH,
              "Wrong type of argument #%d (%s) for the XPath function %s.",1,pcVar6,"sum(node-set)")
      ;
      args_local._4_4_ = LY_EVALID;
    }
  }
  else {
    if ((*args)->type == LYXP_SET_SCNODE_SET) {
      for (set_item._140_4_ = 0; (uint)set_item._140_4_ < (*pplStack_18)->used;
          set_item._140_4_ = set_item._140_4_ + 1) {
        if (*(int *)((long)((*pplStack_18)->val).nodes + (ulong)(uint)set_item._140_4_ * 0x18 + 0xc)
            == 2) {
          puVar1 = *(ushort **)
                    ((long)((*pplStack_18)->val).nodes + (ulong)(uint)set_item._140_4_ * 0x18);
          if ((*puVar1 & 0xc) == 0) {
            plVar2 = plStack_28->ctx;
            pcVar6 = lys_nodetype2str(*puVar1);
            ly_log(plVar2,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".","xpath_sum",
                   pcVar6,*(undefined8 *)(puVar1 + 0x14));
          }
          else {
            lVar4 = warn_is_numeric_type(*(lysc_type **)(puVar1 + 0x30));
            if (lVar4 == '\0') {
              ly_log(plStack_28->ctx,LY_LLWRN,LY_SUCCESS,
                     "Argument #1 of %s is node \"%s\", not of numeric type.","xpath_sum",
                     *(undefined8 *)(puVar1 + 0x14));
            }
          }
        }
      }
    }
    set_scnode_clear_ctx(plStack_28,1);
    args_local._4_4_ = LY_SUCCESS;
  }
  return args_local._4_4_;
}

Assistant:

static LY_ERR
xpath_sum(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    long double num;
    char *str;
    uint32_t i;
    struct lyxp_set set_item;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (args[0]->type == LYXP_SET_SCNODE_SET) {
            for (i = 0; i < args[0]->used; ++i) {
                if (args[0]->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX) {
                    sleaf = (struct lysc_node_leaf *)args[0]->val.scnodes[i].scnode;
                    if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                        LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__,
                                lys_nodetype2str(sleaf->nodetype), sleaf->name);
                    } else if (!warn_is_numeric_type(sleaf->type)) {
                        LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
                    }
                }
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    set_fill_number(set, 0);

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INARGTYPE, 1, print_set_type(args[0]), "sum(node-set)");
        return LY_EVALID;
    } else if (!args[0]->used) {
        return LY_SUCCESS;
    }

    set_init(&set_item, set);

    set_item.type = LYXP_SET_NODE_SET;
    set_item.val.nodes = calloc(1, sizeof *set_item.val.nodes);
    LY_CHECK_ERR_RET(!set_item.val.nodes, LOGMEM(set->ctx), LY_EMEM);

    set_item.used = 1;
    set_item.size = 1;

    for (i = 0; i < args[0]->used; ++i) {
        set_item.val.nodes[0] = args[0]->val.nodes[i];

        rc = cast_node_set_to_string(&set_item, &str);
        LY_CHECK_RET(rc);
        num = cast_string_to_number(str);
        free(str);
        set->val.num += num;
    }

    free(set_item.val.nodes);

    return LY_SUCCESS;
}